

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luma_quantizer.cpp
# Opt level: O1

float __thiscall LumaQuantizer::transformPQ(LumaQuantizer *this,float val,bool encode)

{
  undefined3 in_register_00000031;
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = this->m_Lmax;
  if (CONCAT31(in_register_00000031,encode) != 0) {
    fVar1 = powf(val / fVar1,0.1593);
    fVar1 = powf((fVar1 * 18.8516 + 0.8359) / (fVar1 * 18.6875 + 1.0),78.8438);
    return fVar1;
  }
  fVar2 = powf(val,0.012683305);
  fVar3 = fVar2 + -0.8359;
  if (fVar3 <= 0.0) {
    fVar3 = 0.0;
  }
  fVar2 = powf(fVar3 / (fVar2 * -18.6875 + 18.8516),6.277464);
  return fVar2 * fVar1;
}

Assistant:

float LumaQuantizer::transformPQ(float val, bool encode)
{
    const float L = m_Lmax,
	      		m = 78.8438, n = 0.1593,
	      		c1 = 0.8359, c2 = 18.8516, c3 = 18.6875;
    	
	if (encode)
	{
	    float Lp = pow(val/L, n);
        return pow((c1 + c2*Lp) / (1 + c3*Lp), m);
	}
	else
	{
	    float Vp = pow(val, 1.0f/m);
        return L * pow( std::max(0.0f, (Vp-c1)) / (c2-c3*Vp), 1.0f/n);
    }
}